

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double r8_gamma(double x)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double zero;
  double z;
  double ysq;
  double y1;
  double y;
  double xnum;
  double xminin;
  double xinf;
  double xden;
  double xbig;
  double value;
  double two;
  double twelve;
  double sum;
  double sqrtpi;
  double res;
  double r8_pi;
  double q [8];
  bool parity;
  double p [8];
  double one;
  int n;
  int i;
  double half;
  double fact;
  double eps;
  double c [7];
  double x_local;
  
  memcpy(&eps,&DAT_00263820,0x38);
  memcpy(&stack0xffffffffffffff38,&DAT_00263860,0x40);
  memcpy(&r8_pi,&DAT_002638a0,0x40);
  bVar1 = false;
  half = 1.0;
  one._0_4_ = 0;
  y1 = x;
  if (x <= 0.0) {
    dVar2 = -x;
    dVar3 = (double)(int)dVar2;
    dVar4 = dVar2 - dVar3;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      return 1.79e+308;
    }
    dVar5 = (double)(int)(dVar3 * 0.5) * 2.0;
    if ((dVar3 != dVar5) || (NAN(dVar3) || NAN(dVar5))) {
      bVar1 = true;
    }
    dVar3 = sin(dVar4 * 3.141592653589793);
    half = -3.141592653589793 / dVar3;
    y1 = dVar2 + 1.0;
  }
  dVar2 = y1;
  if (2.22e-16 <= y1) {
    if (12.0 <= y1) {
      if (171.624 < y1) {
        return 1.79e+308;
      }
      twelve = c[5];
      for (one._4_4_ = 0; one._4_4_ < 6; one._4_4_ = one._4_4_ + 1) {
        twelve = twelve / (y1 * y1) + c[(long)one._4_4_ + -1];
      }
      dVar2 = log(y1);
      sqrtpi = exp((y1 - 0.5) * dVar2 + (twelve / y1 - y1) + 0.9189385332046728);
    }
    else {
      if (1.0 <= y1) {
        one._0_4_ = (int)y1 + -1;
        y1 = y1 - (double)one._0_4_;
        zero = y1 - 1.0;
      }
      else {
        zero = y1;
        y1 = y1 + 1.0;
      }
      y = 0.0;
      xinf = 1.0;
      for (one._4_4_ = 0; one._4_4_ < 8; one._4_4_ = one._4_4_ + 1) {
        y = (y + p[(long)one._4_4_ + -1]) * zero;
        xinf = xinf * zero + q[(long)one._4_4_ + -1];
      }
      sqrtpi = y / xinf + 1.0;
      if (y1 <= dVar2) {
        if (y1 < dVar2) {
          for (one._4_4_ = 1; one._4_4_ <= one._0_4_; one._4_4_ = one._4_4_ + 1) {
            sqrtpi = sqrtpi * y1;
            y1 = y1 + 1.0;
          }
        }
      }
      else {
        sqrtpi = sqrtpi / dVar2;
      }
    }
  }
  else {
    if (y1 < 2.23e-308) {
      return 1.79e+308;
    }
    sqrtpi = 1.0 / y1;
  }
  if (bVar1) {
    sqrtpi = -sqrtpi;
  }
  if ((half != 1.0) || (NAN(half))) {
    sqrtpi = half / sqrtpi;
  }
  return sqrtpi;
}

Assistant:

double r8_gamma ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_GAMMA evaluates Gamma(X) for a real argument.
//
//  Discussion:
//
//    This routine calculates the gamma function for a real argument X.
//
//    Computation is based on an algorithm outlined in reference 1.
//    The program uses rational functions that approximate the gamma
//    function to at least 20 significant decimal digits.  Coefficients
//    for the approximation over the interval (1,2) are unpublished.
//    Those for the approximation for 12 <= X are from reference 2.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 January 2008
//
//  Author:
//
//    Original FORTRAN77 version by William Cody, Laura Stoltz.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody,
//    An Overview of Software Development for Special Functions,
//    in Numerical Analysis Dundee, 1975,
//    edited by GA Watson,
//    Lecture Notes in Mathematics 506,
//    Springer, 1976.
//
//    John Hart, Ward Cheney, Charles Lawson, Hans Maehly,
//    Charles Mesztenyi, John Rice, Henry Thatcher,
//    Christoph Witzgall,
//    Computer Approximations,
//    Wiley, 1968,
//    LC: QA297.C64.
//
//  Parameters:
//
//    Input, double X, the argument of the function.
//
//    Output, double R8_GAMMA, the value of the function.
//
{
//
//  Coefficients for minimax approximation over (12, INF).
//
  double c[7] = {
   -1.910444077728E-03, 
    8.4171387781295E-04, 
   -5.952379913043012E-04, 
    7.93650793500350248E-04, 
   -2.777777777777681622553E-03, 
    8.333333333333333331554247E-02, 
    5.7083835261E-03 };
  double eps = 2.22E-16;
  double fact;
  double half = 0.5;
  int i;
  int n;
  double one = 1.0;
  double p[8] = {
  -1.71618513886549492533811E+00,
   2.47656508055759199108314E+01, 
  -3.79804256470945635097577E+02,
   6.29331155312818442661052E+02, 
   8.66966202790413211295064E+02,
  -3.14512729688483675254357E+04, 
  -3.61444134186911729807069E+04,
   6.64561438202405440627855E+04 };
  bool parity;
  double q[8] = {
  -3.08402300119738975254353E+01,
   3.15350626979604161529144E+02, 
  -1.01515636749021914166146E+03,
  -3.10777167157231109440444E+03, 
   2.25381184209801510330112E+04,
   4.75584627752788110767815E+03, 
  -1.34659959864969306392456E+05,
  -1.15132259675553483497211E+05 };
  const double r8_pi = 3.1415926535897932384626434;
  double res;
  double sqrtpi = 0.9189385332046727417803297;
  double sum;
  double twelve = 12.0;
  double two = 2.0;
  double value;
  double xbig = 171.624;
  double xden;
  double xinf = 1.79E+308;
  double xminin = 2.23E-308;
  double xnum;
  double y;
  double y1;
  double ysq;
  double z;
  double zero = 0.0;;

  parity = false;
  fact = one;
  n = 0;
  y = x;
//
//  Argument is negative.
//
  if ( y <= zero )
  {
    y = - x;
    y1 = double(int( y ));
    res = y - y1;

    if ( res != zero )
    {
      if ( y1 != double(int( y1 * half ) * two ))
      {
        parity = true;
      }

      fact = - r8_pi / sin ( r8_pi * res );
      y = y + one;
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
//
//  Argument is positive.
//
  if ( y < eps )
  {
//
//  Argument < EPS.
//
    if ( xminin <= y )
    {
      res = one / y;
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
  else if ( y < twelve )
  {
    y1 = y;
//
//  0.0 < argument < 1.0.
//
    if ( y < one )
    {
      z = y;
      y = y + one;
    }
//
//  1.0 < argument < 12.0.
//  Reduce argument if necessary.
//
    else
    {
      n = int( y ) - 1;
      y = y - double( n );
      z = y - one;
    }
//
//  Evaluate approximation for 1.0 < argument < 2.0.
//
    xnum = zero;
    xden = one;
    for ( i = 0; i < 8; i++ )
    {
      xnum = ( xnum + p[i] ) * z;
      xden = xden * z + q[i];
    }
    res = xnum / xden + one;
//
//  Adjust result for case  0.0 < argument < 1.0.
//
    if ( y1 < y )
    {
      res = res / y1;
    }
//
//  Adjust result for case 2.0 < argument < 12.0.
//
    else if ( y < y1 )
    {
      for ( i = 1; i <= n; i++ )
      {
        res = res * y;
        y = y + one;
      }
    }
  }
  else
  {
//
//  Evaluate for 12.0 <= argument.
//
    if ( y <= xbig )
    {
      ysq = y * y;
      sum = c[6];
      for ( i = 0; i < 6; i++ )
      {
        sum = sum / ysq + c[i];
      }
      sum = sum / y - y + sqrtpi;
      sum = sum + ( y - half ) * log ( y );
      res = exp ( sum );
    }
    else
    {
      res = xinf;
      value = res;
      return value;
    }
  }
//
//  Final adjustments and return.
//
  if ( parity )
  {
    res = - res;
  }

  if ( fact != one )
  {
    res = fact / res;
  }

  value = res;

  return value;
}